

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_triangle_from_direction
               (nk_vec2 *result,nk_rect r,float pad_x,float pad_y,nk_heading direction)

{
  nk_vec2 nVar1;
  nk_vec2 nVar2;
  nk_vec2 nVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  if (result == (nk_vec2 *)0x0) {
    __assert_fail("result",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x188e,
                  "void nk_triangle_from_direction(struct nk_vec2 *, struct nk_rect, float, float, enum nk_heading)"
                 );
  }
  fVar6 = r.x + pad_x;
  fVar5 = pad_x + pad_x;
  fVar7 = r.w;
  if (r.w <= fVar5) {
    fVar7 = fVar5;
  }
  fVar8 = pad_y + pad_y;
  fVar4 = r.h;
  if (r.h <= fVar8) {
    fVar4 = fVar8;
  }
  fVar7 = fVar7 - fVar5;
  fVar4 = fVar4 - fVar8;
  fVar5 = r.y + pad_y;
  if (direction != NK_DOWN) {
    if (direction == NK_RIGHT) {
      result->x = fVar6;
      result->y = fVar5;
      result[1].x = fVar7 + fVar6;
      result[1].y = fVar4 * 0.5 + fVar5;
    }
    else {
      if (direction != NK_UP) {
        result->x = fVar6;
        result->y = fVar4 * 0.5 + fVar5;
        result[1].x = fVar7 + fVar6;
        result[1].y = fVar5;
        nVar3.y = fVar4 + fVar5;
        nVar3.x = fVar7 + fVar6;
        result[2] = nVar3;
        return;
      }
      result->x = fVar7 * 0.5 + fVar6;
      result->y = fVar5;
      result[1].x = fVar7 + fVar6;
      result[1].y = fVar4 + fVar5;
    }
    nVar2.y = fVar4 + fVar5;
    nVar2.x = fVar6;
    result[2] = nVar2;
    return;
  }
  result->x = fVar6;
  result->y = fVar5;
  result[1].x = fVar7 + fVar6;
  result[1].y = fVar5;
  nVar1.y = fVar4 + fVar5;
  nVar1.x = fVar7 * 0.5 + fVar6;
  result[2] = nVar1;
  return;
}

Assistant:

NK_API void
nk_triangle_from_direction(struct nk_vec2 *result, struct nk_rect r,
    float pad_x, float pad_y, enum nk_heading direction)
{
    float w_half, h_half;
    NK_ASSERT(result);

    r.w = NK_MAX(2 * pad_x, r.w);
    r.h = NK_MAX(2 * pad_y, r.h);
    r.w = r.w - 2 * pad_x;
    r.h = r.h - 2 * pad_y;

    r.x = r.x + pad_x;
    r.y = r.y + pad_y;

    w_half = r.w / 2.0f;
    h_half = r.h / 2.0f;

    if (direction == NK_UP) {
        result[0] = nk_vec2(r.x + w_half, r.y);
        result[1] = nk_vec2(r.x + r.w, r.y + r.h);
        result[2] = nk_vec2(r.x, r.y + r.h);
    } else if (direction == NK_RIGHT) {
        result[0] = nk_vec2(r.x, r.y);
        result[1] = nk_vec2(r.x + r.w, r.y + h_half);
        result[2] = nk_vec2(r.x, r.y + r.h);
    } else if (direction == NK_DOWN) {
        result[0] = nk_vec2(r.x, r.y);
        result[1] = nk_vec2(r.x + r.w, r.y);
        result[2] = nk_vec2(r.x + w_half, r.y + r.h);
    } else {
        result[0] = nk_vec2(r.x, r.y + h_half);
        result[1] = nk_vec2(r.x + r.w, r.y);
        result[2] = nk_vec2(r.x + r.w, r.y + r.h);
    }
}